

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_o3lyp.c
# Opt level: O0

void o3lyp_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double clyp;
  double c;
  double b;
  double a;
  double a1;
  
  dVar1 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = get_ext_param(in_RDI,in_RSI,1);
  dVar3 = get_ext_param(in_RDI,in_RSI,2);
  dVar4 = get_ext_param(in_RDI,in_RSI,3);
  *in_RDI->mix_coef = dVar3 * -1.05151 + dVar2;
  in_RDI->mix_coef[1] = dVar3;
  in_RDI->mix_coef[2] = 1.0 - dVar4;
  in_RDI->mix_coef[3] = dVar4;
  in_RDI->cam_alpha = dVar1;
  return;
}

Assistant:

static void
o3lyp_set_ext_params(xc_func_type *p, const double *ext_params)
{
  /* This is the fraction of LDA exchange in OPTX */
  const double a1 = 1.05151;
  double a, b, c, clyp;

  assert(p != NULL);
  a    = get_ext_param(p, ext_params, 0);
  b    = get_ext_param(p, ext_params, 1);
  c    = get_ext_param(p, ext_params, 2);
  clyp = get_ext_param(p, ext_params, 3);

  /* Remove double counting of LDA exchange */
  p->mix_coef[0] = b - a1*c;
  p->mix_coef[1] = c;
  p->mix_coef[2] = 1.0 - clyp;
  p->mix_coef[3] = clyp;

  p->cam_alpha = a;
}